

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CutPerformCheck16(If_Man_t *p,uint *pTruth0,int nVars,int nLeaves,char *pStr)

{
  int iVar1;
  size_t sVar2;
  int local_10a8;
  int local_109c;
  If_Grp_t local_1084;
  If_Grp_t local_1072;
  int local_1060;
  int local_105c;
  int Length;
  int nLutRoot;
  int nLutLeaf2;
  int nLutLeaf;
  int i;
  If_Grp_t G1;
  uint pTruth [1024];
  char *pStr_local;
  int nLeaves_local;
  int nVars_local;
  uint *pTruth0_local;
  If_Man_t *p_local;
  
  memset((void *)((long)&nLutLeaf + 2),0,0x12);
  if (nVars < 6) {
    __assert_fail("nVars >= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec16.c"
                  ,0x8ae,"int If_CutPerformCheck16(If_Man_t *, unsigned int *, int, int, char *)");
  }
  iVar1 = Abc_TtWordNum(nVars);
  memcpy(G1.pVars + 8,pTruth0,(long)iVar1 << 3);
  Abc_TtStretch6((word *)(G1.pVars + 8),nLeaves,p->pPars->nLutSize);
  pStr_local._0_4_ = nLeaves;
  if (p->pPars->fCutMin == 0) {
    pStr_local._0_4_ = Abc_TtMinBase((word *)(G1.pVars + 8),(int *)0x0,nLeaves,nVars);
  }
  sVar2 = strlen(pStr);
  local_1060 = (int)sVar2;
  if ((local_1060 == 2) || (local_1060 == 3)) {
    for (nLutLeaf2 = 0; nLutLeaf2 < local_1060; nLutLeaf2 = nLutLeaf2 + 1) {
      if ((pStr[nLutLeaf2] + -0x30 < 3) || (6 < pStr[nLutLeaf2] + -0x30)) {
        printf("The LUT size (%d) should belong to {3,4,5,6}.\n",
               (ulong)((int)pStr[nLutLeaf2] - 0x30));
        return 0;
      }
    }
    nLutRoot = *pStr + -0x30;
    if (local_1060 == 3) {
      local_109c = pStr[1] + -0x30;
    }
    else {
      local_109c = 0;
    }
    Length = local_109c;
    local_105c = pStr[local_1060 + -1] + -0x30;
    if (local_109c == 0) {
      local_10a8 = 0;
    }
    else {
      local_10a8 = local_109c + -1;
    }
    if (*pStr + -0x31 + local_10a8 + local_105c < (int)(uint)pStr_local) {
      printf("The cut size (%d) is too large for the LUT structure %s.\n",(ulong)(uint)pStr_local,
             pStr);
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = Abc_MaxInt(nLutRoot,local_105c);
      iVar1 = Abc_MaxInt(local_109c,iVar1);
      if (iVar1 < (int)(uint)pStr_local) {
        if (local_1060 == 2) {
          If_CluCheck(&local_1072,p,(word *)(G1.pVars + 8),(uint)pStr_local,0,0,nLutRoot,local_105c,
                      (If_Grp_t *)0x0,(word *)0x0,(word *)0x0,(word *)0x0,1);
          nLutLeaf._2_1_ = local_1072.nVars;
        }
        else {
          If_CluCheck3(&local_1084,p,(word *)(G1.pVars + 8),(uint)pStr_local,nLutRoot,Length,
                       local_105c,(If_Grp_t *)0x0,(If_Grp_t *)0x0,(word *)0x0,(word *)0x0,
                       (word *)0x0);
          nLutLeaf._2_1_ = local_1084.nVars;
        }
        p_local._4_4_ = (uint)('\0' < nLutLeaf._2_1_);
      }
      else {
        p_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("Wrong LUT struct (%s)\n",pStr);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int If_CutPerformCheck16( If_Man_t * p, unsigned * pTruth0, int nVars, int nLeaves, char * pStr )
{
    unsigned pTruth[IF_MAX_FUNC_LUTSIZE > 5 ? 1 << (IF_MAX_FUNC_LUTSIZE - 5) : 1];
    If_Grp_t G1 = {0};//, G3 = {0};
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;
    // stretch the truth table
    assert( nVars >= 6 );
    memcpy( pTruth, pTruth0, sizeof(word) * Abc_TtWordNum(nVars) );
    Abc_TtStretch6( (word *)pTruth, nLeaves, p->pPars->nLutSize );

#ifdef IF_TRY_NEW
    {
        word pCopy[1024];
        int nWords = Abc_TruthWordNum(nVars);
        int iNum;
        if ( s_vTtMem == NULL )
        {
            s_vTtMem = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 ); // 32 KB/page for 6-var functions
            Vec_MemHashAlloc( s_vTtMem, 10000 );
        }
        if ( s_vTtMem2 == NULL )
        {
            s_vTtMem2 = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 ); // 32 KB/page for 6-var functions
            Vec_MemHashAlloc( s_vTtMem2, 10000 );
        }
        memcpy( pCopy, pTruth, sizeof(word) * Abc_Truth6WordNum(nVars) );
        if ( pCopy[0] & 1 )
            for ( i = 0; i < nWords; i++ )
                pCopy[i] = ~pCopy[i];
        iNum = Vec_MemHashInsert( s_vTtMem, pCopy );
        if ( iNum == Vec_MemEntryNum(s_vTtMem) - 1 )
        {
            int pCanonPerm[16];
            char pCanonPermC[16];
            Abc_TtCanonicize( pCopy, nVars, pCanonPermC );
//            If_CluSemiCanonicize( pCopy, nVars, pCanonPerm );
            Vec_MemHashInsert( s_vTtMem2, pCopy );
        }
    }
#endif

    // if cutmin is disabled, minimize the function
    if ( !p->pPars->fCutMin )
        nLeaves = Abc_TtMinBase( (word *)pTruth, NULL, nLeaves, nVars );

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return 0;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return 0;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The cut size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return 0;
    }
    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
        return 1;

    // derive the first group
    if ( Length == 2 )
        G1 = If_CluCheck( p, (word *)pTruth, nLeaves, 0, 0, nLutLeaf, nLutRoot, NULL, NULL, NULL, NULL, 1 );
    else
        G1 = If_CluCheck3( p, (word *)pTruth, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, NULL, NULL, NULL, NULL, NULL );

//    if ( G1.nVars > 0 )
//        If_CluPrintGroup( &G1 );

    return (int)(G1.nVars > 0);
}